

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImVector<int>::push_front(ImVector<int> *this,int *v)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = this->Size;
  if (iVar1 == 0) {
    if (this->Capacity == 0) {
      piVar3 = (int *)ImGui::MemAlloc(0x20);
      if (this->Data != (int *)0x0) {
        memcpy(piVar3,this->Data,(long)this->Size << 2);
        ImGui::MemFree(this->Data);
      }
      this->Data = piVar3;
      this->Capacity = 8;
    }
    piVar3 = this->Data + this->Size;
  }
  else {
    if (iVar1 < 0) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                    ,0x4f2,"T *ImVector<int>::insert(const T *, const T &) [T = int]");
    }
    iVar2 = this->Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        uVar4 = 8;
      }
      else {
        uVar4 = iVar2 / 2 + iVar2;
      }
      uVar5 = iVar1 + 1U;
      if ((int)(iVar1 + 1U) < (int)uVar4) {
        uVar5 = uVar4;
      }
      if (iVar2 < (int)uVar5) {
        piVar3 = (int *)ImGui::MemAlloc((ulong)uVar5 << 2);
        if (this->Data != (int *)0x0) {
          memcpy(piVar3,this->Data,(long)this->Size << 2);
          ImGui::MemFree(this->Data);
        }
        this->Data = piVar3;
        this->Capacity = uVar5;
      }
    }
    if (0 < (long)this->Size) {
      memmove(this->Data + 1,this->Data,(long)this->Size << 2);
    }
    piVar3 = this->Data;
  }
  *piVar3 = *v;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }